

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::TestFileAccess(char *filename,TestFilePermissions permissions)

{
  allocator<char> local_41;
  string local_40;
  TestFilePermissions local_1c;
  char *pcStack_18;
  TestFilePermissions permissions_local;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local._7_1_ = 0;
  }
  else {
    local_1c = permissions;
    pcStack_18 = filename;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,filename,&local_41);
    filename_local._7_1_ = TestFileAccess(&local_40,local_1c);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (bool)(filename_local._7_1_ & 1);
}

Assistant:

bool SystemTools::TestFileAccess(const char* filename,
                                 TestFilePermissions permissions)
{
  if (!filename) {
    return false;
  }
  return SystemTools::TestFileAccess(std::string(filename), permissions);
}